

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintWideCharsAsStringTo(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t c;
  bool bVar1;
  int iVar2;
  CharFormat CVar3;
  ulong uStack_30;
  wchar_t cur;
  size_t index;
  bool is_previous_hex;
  ostream *os_local;
  size_t len_local;
  wchar_t *begin_local;
  
  std::operator<<(os,"L\"");
  bVar1 = false;
  for (uStack_30 = 0; uStack_30 < len; uStack_30 = uStack_30 + 1) {
    c = begin[uStack_30];
    if (((bVar1) && (iVar2 = isascii(c), iVar2 != 0)) && (bVar1 = IsXDigit((char)c), bVar1)) {
      std::operator<<(os,"\" L\"");
    }
    CVar3 = PrintAsWideStringLiteralTo(c,os);
    bVar1 = CVar3 == kHexEscape;
  }
  std::operator<<(os,"\"");
  return;
}

Assistant:

static void PrintWideCharsAsStringTo(const wchar_t* begin, size_t len,
                                     ostream* os) {
  *os << "L\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const wchar_t cur = begin[index];
    if (is_previous_hex && isascii(cur) && IsXDigit(static_cast<char>(cur))) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" L\"";
    }
    is_previous_hex = PrintAsWideStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}